

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

int maxdirfiltered<btVector3>
              (btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  btVector3 *this;
  ulong uVar4;
  btScalar bVar5;
  btScalar bVar6;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar3;
  }
  uVar2 = 0xffffffffffffffff;
  this = p;
  do {
    iVar1 = (int)uVar2;
    if (uVar4 == uVar3) {
      return iVar1;
    }
    if (allow->m_data[uVar3] != 0) {
      if (iVar1 != -1) {
        bVar5 = btVector3::dot(this,dir);
        bVar6 = btVector3::dot(p + iVar1,dir);
        if (bVar5 <= bVar6) goto LAB_00125d5a;
      }
      uVar2 = uVar3 & 0xffffffff;
    }
LAB_00125d5a:
    uVar3 = uVar3 + 1;
    this = this + 1;
  } while( true );
}

Assistant:

int maxdirfiltered(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	btAssert(count);
	int m=-1;
	for(int i=0;i<count;i++) 
		if(allow[i])
		{
			if(m==-1 || btDot(p[i],dir)>btDot(p[m],dir))
				m=i;
		}
	btAssert(m!=-1);
	return m;
}